

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall JetHead::vector<Regex::GroupData>::~vector(vector<Regex::GroupData> *this)

{
  if (this->mData != (GroupData *)0x0) {
    clear(this);
    if (this->mData != (GroupData *)0x0) {
      operator_delete__(this->mData);
    }
    this->mData = (GroupData *)0x0;
  }
  return;
}

Assistant:

~vector()
		{
			if (mData)
			{
				// Call all of our destructors for contained objects
				clear();
				
				// Free memory
				delete[] (uint8_t*)mData;
				mData = NULL;
			}
		}